

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

Curl_multi * Curl_multi_handle(int hashsize,int chashsize)

{
  int iVar1;
  Curl_multi *pCVar2;
  curl_llist *pcVar3;
  SessionHandle *pSVar4;
  Curl_multi *multi;
  int chashsize_local;
  int hashsize_local;
  
  pCVar2 = (Curl_multi *)(*Curl_ccalloc)(1,0x180);
  if (pCVar2 != (Curl_multi *)0x0) {
    pCVar2->type = 0xbab1e;
    iVar1 = Curl_mk_dnscache(&pCVar2->hostcache);
    if (((iVar1 == 0) && (iVar1 = sh_init(&pCVar2->sockhash,hashsize), iVar1 == 0)) &&
       (iVar1 = Curl_conncache_init(&pCVar2->conn_cache,chashsize), iVar1 == 0)) {
      pcVar3 = Curl_llist_alloc(multi_freeamsg);
      pCVar2->msglist = pcVar3;
      if (pCVar2->msglist != (curl_llist *)0x0) {
        pcVar3 = Curl_llist_alloc(multi_freeamsg);
        pCVar2->pending = pcVar3;
        if (pCVar2->pending != (curl_llist *)0x0) {
          pSVar4 = (SessionHandle *)curl_easy_init();
          pCVar2->closure_handle = pSVar4;
          if (pCVar2->closure_handle != (SessionHandle *)0x0) {
            pCVar2->closure_handle->multi = pCVar2;
            (pCVar2->closure_handle->state).conn_cache = &pCVar2->conn_cache;
            pCVar2->max_pipeline_length = 5;
            pCVar2->maxconnects = -1;
            return pCVar2;
          }
        }
      }
    }
    Curl_hash_destroy(&pCVar2->sockhash);
    Curl_hash_destroy(&pCVar2->hostcache);
    Curl_conncache_destroy(&pCVar2->conn_cache);
    Curl_close(pCVar2->closure_handle);
    pCVar2->closure_handle = (SessionHandle *)0x0;
    Curl_llist_destroy(pCVar2->msglist,(void *)0x0);
    Curl_llist_destroy(pCVar2->pending,(void *)0x0);
    (*Curl_cfree)(pCVar2);
  }
  return (Curl_multi *)0x0;
}

Assistant:

struct Curl_multi *Curl_multi_handle(int hashsize, /* socket hash */
                                     int chashsize) /* connection hash */
{
  struct Curl_multi *multi = calloc(1, sizeof(struct Curl_multi));

  if(!multi)
    return NULL;

  multi->type = CURL_MULTI_HANDLE;

  if(Curl_mk_dnscache(&multi->hostcache))
    goto error;

  if(sh_init(&multi->sockhash, hashsize))
    goto error;

  if(Curl_conncache_init(&multi->conn_cache, chashsize))
    goto error;

  multi->msglist = Curl_llist_alloc(multi_freeamsg);
  if(!multi->msglist)
    goto error;

  multi->pending = Curl_llist_alloc(multi_freeamsg);
  if(!multi->pending)
    goto error;

  /* allocate a new easy handle to use when closing cached connections */
  multi->closure_handle = curl_easy_init();
  if(!multi->closure_handle)
    goto error;

  multi->closure_handle->multi = multi;
  multi->closure_handle->state.conn_cache = &multi->conn_cache;

  multi->max_pipeline_length = 5;

  /* -1 means it not set by user, use the default value */
  multi->maxconnects = -1;
  return (CURLM *) multi;

  error:

  Curl_hash_destroy(&multi->sockhash);
  Curl_hash_destroy(&multi->hostcache);
  Curl_conncache_destroy(&multi->conn_cache);
  Curl_close(multi->closure_handle);
  multi->closure_handle = NULL;
  Curl_llist_destroy(multi->msglist, NULL);
  Curl_llist_destroy(multi->pending, NULL);

  free(multi);
  return NULL;
}